

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::execute
          (TessEvaluationExecutor *this,int numValues,void **inputs,void **outputs)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deInt32 numValues_00;
  deUint32 dVar4;
  undefined4 extraout_var;
  int alignedValues;
  Functions *gl;
  void **outputs_local;
  void **inputs_local;
  int numValues_local;
  TessEvaluationExecutor *this_local;
  long lVar5;
  
  iVar3 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  numValues_00 = deAlign32(numValues,2);
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues_00);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  bVar2 = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::empty(&(this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar5 + 0x48);
    dVar4 = BufferIoExecutor::getInputBuffer(&this->super_BufferIoExecutor);
    (*pcVar1)(0x90d2,0,dVar4);
  }
  pcVar1 = *(code **)(lVar5 + 0x48);
  dVar4 = BufferIoExecutor::getOutputBuffer(&this->super_BufferIoExecutor);
  (*pcVar1)(0x90d2,1,dVar4);
  (**(code **)(lVar5 + 0xfd8))(0x8e72,2);
  (**(code **)(lVar5 + 0x538))(0xe,0,numValues_00);
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void TessEvaluationExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const int				alignedValues	= deAlign32(numValues, 2);

	// Initialize buffers with aligned value count to make room for padding
	initBuffers(alignedValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	// \todo [2014-06-26 pyry] Duplicate last value in the buffer to prevent infinite loops for example?

	if (!m_inputs.empty())
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer());

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer());

	// Render patches
	gl.patchParameteri(GL_PATCH_VERTICES, 2);
	gl.drawArrays(GL_PATCHES, 0, alignedValues);

	// Read back data
	readOutputBuffer(outputs, numValues);
}